

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffghpr(fitsfile *fptr,int maxdim,int *simple,int *bitpix,int *naxis,long *naxes,long *pcount,
          long *gcount,int *extend,int *status)

{
  LONGLONG local_388;
  LONGLONG tnaxes [99];
  double ddummy;
  LONGLONG lldummy;
  int ii;
  int idummy;
  long *naxes_local;
  int *naxis_local;
  int *bitpix_local;
  int *simple_local;
  fitsfile *pfStack_30;
  int maxdim_local;
  fitsfile *fptr_local;
  
  _ii = naxes;
  naxes_local = (long *)naxis;
  naxis_local = bitpix;
  bitpix_local = simple;
  simple_local._4_4_ = maxdim;
  pfStack_30 = fptr;
  ffgphd(fptr,maxdim,simple,bitpix,naxis,&local_388,pcount,gcount,extend,(double *)(tnaxes + 0x62),
         (double *)(tnaxes + 0x62),(LONGLONG *)&ddummy,(int *)((long)&lldummy + 4),status);
  if ((naxes_local == (long *)0x0) || (_ii == (long *)0x0)) {
    if (_ii != (long *)0x0) {
      for (lldummy._0_4_ = 0; (int)lldummy < simple_local._4_4_; lldummy._0_4_ = (int)lldummy + 1) {
        _ii[(int)lldummy] = tnaxes[(long)(int)lldummy + -1];
      }
    }
  }
  else {
    for (lldummy._0_4_ = 0; (int)lldummy < (int)*naxes_local && (int)lldummy < simple_local._4_4_;
        lldummy._0_4_ = (int)lldummy + 1) {
      _ii[(int)lldummy] = tnaxes[(long)(int)lldummy + -1];
    }
  }
  return *status;
}

Assistant:

int ffghpr(fitsfile *fptr,  /* I - FITS file pointer                        */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *simple,     /* O - does file conform to FITS standard? 1/0  */
           int *bitpix,     /* O - number of bits per data value pixel      */
           int *naxis,      /* O - number of axes in the data array         */
           long naxes[],    /* O - length of each data axis                 */
           long *pcount,    /* O - number of group parameters (usually 0)   */
           long *gcount,    /* O - number of random groups (usually 1 or 0) */
           int *extend,     /* O - may FITS file haave extensions?          */
           int *status)     /* IO - error status                            */
/*
  Get keywords from the Header of the PRimary array:
  Check that the keywords conform to the FITS standard and return the
  parameters which determine the size and structure of the primary array
  or IMAGE extension.
*/
{
    int idummy, ii;
    LONGLONG lldummy;
    double ddummy;
    LONGLONG tnaxes[99];

    ffgphd(fptr, maxdim, simple, bitpix, naxis, tnaxes, pcount, gcount, extend,
          &ddummy, &ddummy, &lldummy, &idummy, status);
	  
    if (naxis && naxes) {
         for (ii = 0; (ii < *naxis) && (ii < maxdim); ii++)
	     naxes[ii] = (long) tnaxes[ii];
    } else if (naxes) {
         for (ii = 0; ii < maxdim; ii++)
	     naxes[ii] = (long) tnaxes[ii];
    }

    return(*status);
}